

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_ND_C.cpp
# Opt level: O3

void amrex::EB2::intercept_to_edge_centroid
               (Array4<double> *excent,Array4<double> *eycent,Array4<double> *ezcent,
               Array4<const_unsigned_int> *fx,Array4<const_unsigned_int> *fy,
               Array4<const_unsigned_int> *fz,Array4<const_double> *levset,GpuArray<double,_3U> *dx,
               GpuArray<double,_3U> *problo)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  uint *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_78;
  
  dVar26 = dx->arr[1];
  dVar1 = dx->arr[2];
  iVar2 = (excent->begin).z;
  local_98 = (long)iVar2;
  iVar3 = (excent->end).z;
  if (iVar2 < iVar3) {
    dVar28 = dx->arr[0];
    iVar2 = (excent->end).y;
    iVar4 = (excent->end).x;
    iVar5 = (excent->begin).y;
    iVar6 = (excent->begin).x;
    lVar16 = (long)iVar6;
    local_78 = 0;
    do {
      if (iVar5 < iVar2) {
        lVar23 = fx->jstride * 4;
        lVar19 = (long)fx->p +
                 ((long)iVar5 - (long)(fx->begin).y) * lVar23 +
                 (local_98 - (fx->begin).z) * fx->kstride * 4 + (long)(fx->begin).x * -4 +
                 lVar16 * 4;
        lVar15 = 0;
        lVar22 = (long)iVar5;
        do {
          if (iVar6 < iVar4) {
            pdVar12 = levset->p;
            lVar17 = (lVar22 - (levset->begin).y) * levset->jstride;
            iVar7 = (levset->begin).x;
            lVar20 = (local_98 - (levset->begin).z) * levset->kstride;
            lVar18 = excent->jstride * lVar15 + excent->kstride * local_78;
            pdVar13 = excent->p;
            lVar24 = 0;
            do {
              iVar8 = *(int *)(lVar19 + lVar24 * 4);
              dVar27 = 1.0;
              if (iVar8 != 0) {
                if (iVar8 == 1) {
                  dVar27 = -1.0;
                }
                else {
                  uVar25 = -(ulong)(pdVar12[lVar16 + ((lVar20 + lVar17 + lVar24) - (long)iVar7)] <
                                   pdVar12[lVar17 + lVar20 + (((iVar6 + 1) - iVar7) + (int)lVar24)])
                  ;
                  dVar27 = (*(double *)((long)pdVar13 + lVar24 * 8 + lVar18) -
                           ((double)((int)lVar24 + iVar6) * dx->arr[0] + problo->arr[0])) * 0.5 *
                           (1.0 / dVar28);
                  dVar27 = (double)((ulong)(dVar27 + -0.5) & uVar25 | ~uVar25 & (ulong)dVar27);
                  if (dVar27 <= -0.5) {
                    dVar27 = -0.5;
                  }
                  if (0.5 <= dVar27) {
                    dVar27 = 0.5;
                  }
                }
              }
              *(double *)((long)pdVar13 + lVar24 * 8 + lVar18) = dVar27;
              lVar24 = lVar24 + 1;
            } while (iVar4 - lVar16 != lVar24);
          }
          lVar22 = lVar22 + 1;
          lVar19 = lVar19 + lVar23;
          lVar15 = lVar15 + 8;
        } while (lVar22 != iVar2);
      }
      local_98 = local_98 + 1;
      local_78 = local_78 + 8;
    } while (local_98 != iVar3);
  }
  iVar2 = (eycent->begin).z;
  local_a0 = (long)iVar2;
  iVar3 = (eycent->end).z;
  if (iVar2 < iVar3) {
    iVar2 = (eycent->end).y;
    iVar4 = (eycent->end).x;
    iVar5 = (eycent->begin).y;
    iVar6 = (eycent->begin).x;
    lVar16 = (long)iVar6;
    local_90 = 0;
    do {
      if (iVar5 < iVar2) {
        iVar7 = (fy->begin).x;
        iVar8 = (fy->begin).y;
        lVar22 = fy->jstride;
        iVar9 = (fy->begin).z;
        puVar14 = fy->p;
        lVar15 = fy->kstride;
        lVar19 = (long)iVar5;
        do {
          if (iVar6 < iVar4) {
            iVar10 = (levset->begin).y;
            lVar23 = eycent->kstride * local_90 + (lVar19 - iVar5) * eycent->jstride * 8;
            lVar18 = levset->jstride * 8;
            lVar17 = (local_a0 - (levset->begin).z) * levset->kstride;
            lVar20 = (long)(levset->begin).x;
            pdVar12 = eycent->p;
            pdVar13 = levset->p;
            lVar24 = 0;
            do {
              iVar11 = *(int *)((long)puVar14 +
                               lVar24 * 4 +
                               (lVar19 - iVar8) * lVar22 * 4 +
                               (local_a0 - iVar9) * lVar15 * 4 + (long)iVar7 * -4 + lVar16 * 4);
              dVar28 = 1.0;
              if (iVar11 != 0) {
                if (iVar11 == 1) {
                  dVar28 = -1.0;
                }
                else {
                  uVar25 = -(ulong)(*(double *)
                                     ((long)pdVar13 +
                                     lVar24 * 8 +
                                     (lVar19 - iVar10) * lVar18 + lVar17 * 8 + lVar20 * -8 +
                                     lVar16 * 8) <
                                   *(double *)
                                    ((long)pdVar13 +
                                    lVar24 * 8 +
                                    lVar18 * (((int)lVar19 + 1) - iVar10) + lVar17 * 8 + lVar20 * -8
                                    + lVar16 * 8));
                  dVar28 = (*(double *)((long)pdVar12 + lVar24 * 8 + lVar23) -
                           (dx->arr[1] * (double)(int)lVar19 + problo->arr[1])) * 0.5 *
                           (1.0 / dVar26);
                  dVar28 = (double)((ulong)(dVar28 + -0.5) & uVar25 | ~uVar25 & (ulong)dVar28);
                  if (dVar28 <= -0.5) {
                    dVar28 = -0.5;
                  }
                  if (0.5 <= dVar28) {
                    dVar28 = 0.5;
                  }
                }
              }
              *(double *)((long)pdVar12 + lVar24 * 8 + lVar23) = dVar28;
              lVar24 = lVar24 + 1;
            } while (iVar4 - lVar16 != lVar24);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != iVar2);
      }
      local_a0 = local_a0 + 1;
      local_90 = local_90 + 8;
    } while (local_a0 != iVar3);
  }
  iVar2 = (ezcent->begin).z;
  iVar3 = (ezcent->end).z;
  if (iVar2 < iVar3) {
    iVar4 = (ezcent->end).y;
    iVar5 = (ezcent->end).x;
    iVar6 = (ezcent->begin).y;
    iVar7 = (ezcent->begin).x;
    lVar16 = (long)iVar7;
    local_a8 = (long)iVar2;
    do {
      if (iVar6 < iVar4) {
        lVar23 = fz->jstride * 4;
        lVar15 = (long)fz->p +
                 ((long)iVar6 - (long)(fz->begin).y) * lVar23 +
                 (local_a8 - (fz->begin).z) * fz->kstride * 4 + (long)(fz->begin).x * -4 +
                 lVar16 * 4;
        lVar19 = 0;
        lVar22 = (long)iVar6;
        do {
          if (iVar7 < iVar5) {
            iVar8 = (levset->begin).z;
            lVar21 = ezcent->jstride * lVar19 + ezcent->kstride * (local_a8 - iVar2) * 8;
            lVar17 = levset->kstride * 8;
            lVar20 = (lVar22 - (levset->begin).y) * levset->jstride;
            lVar18 = (long)(levset->begin).x;
            pdVar12 = ezcent->p;
            pdVar13 = levset->p;
            lVar24 = 0;
            do {
              iVar9 = *(int *)(lVar15 + lVar24 * 4);
              dVar26 = 1.0;
              if (iVar9 != 0) {
                if (iVar9 == 1) {
                  dVar26 = -1.0;
                }
                else {
                  uVar25 = -(ulong)(*(double *)
                                     ((long)pdVar13 +
                                     lVar24 * 8 +
                                     lVar17 * (local_a8 - iVar8) + lVar20 * 8 + lVar18 * -8 +
                                     lVar16 * 8) <
                                   *(double *)
                                    ((long)pdVar13 +
                                    lVar24 * 8 +
                                    lVar20 * 8 + (((int)local_a8 + 1) - iVar8) * lVar17 +
                                    lVar18 * -8 + lVar16 * 8));
                  dVar26 = (*(double *)((long)pdVar12 + lVar24 * 8 + lVar21) -
                           (dx->arr[2] * (double)(int)local_a8 + problo->arr[2])) * 0.5 *
                           (1.0 / dVar1);
                  dVar26 = (double)((ulong)(dVar26 + -0.5) & uVar25 | ~uVar25 & (ulong)dVar26);
                  if (dVar26 <= -0.5) {
                    dVar26 = -0.5;
                  }
                  if (0.5 <= dVar26) {
                    dVar26 = 0.5;
                  }
                }
              }
              *(double *)((long)pdVar12 + lVar24 * 8 + lVar21) = dVar26;
              lVar24 = lVar24 + 1;
            } while (iVar5 - lVar16 != lVar24);
          }
          lVar22 = lVar22 + 1;
          lVar15 = lVar15 + lVar23;
          lVar19 = lVar19 + 8;
        } while (lVar22 != iVar4);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != iVar3);
  }
  return;
}

Assistant:

void intercept_to_edge_centroid (AMREX_D_DECL(Array4<Real> const& excent,
                                              Array4<Real> const& eycent,
                                              Array4<Real> const& ezcent),
                                 AMREX_D_DECL(Array4<Type_t const> const& fx,
                                              Array4<Type_t const> const& fy,
                                              Array4<Type_t const> const& fz),
                                 Array4<Real const> const& levset,
                                 GpuArray<Real,AMREX_SPACEDIM> const& dx,
                                 GpuArray<Real,AMREX_SPACEDIM> const& problo) noexcept
{
    AMREX_D_TERM(const Real dxinv = Real(1.0)/dx[0];,
                 const Real dyinv = Real(1.0)/dx[1];,
                 const Real dzinv = Real(1.0)/dx[2];)
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
        Box(excent), xbx, {
            AMREX_LOOP_3D(xbx, i, j, k, {
                if (fx(i,j,k) == Type::regular) {
                    excent(i,j,k) = Real(1.0);
                } else if (fx(i,j,k) == Type::covered) {
                    excent(i,j,k) = Real(-1.0);
                } else {
                    Real xcut = Real(0.5)*(excent(i,j,k) - (problo[0]+i*dx[0]))*dxinv;
                    if (levset(i,j,k) < levset(i+1,j,k)) { // right side covered
                        xcut -= Real(0.5);
                    }
                    excent(i,j,k) = amrex::min(Real(0.5),amrex::max(Real(-0.5),xcut));
                }